

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O2

unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> __thiscall
spvtools::MakeUnique<spvtools::opt::Loop,spvtools::opt::IRContext*const&>
          (spvtools *this,IRContext **args)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x90);
  *puVar1 = *args;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[9] = 0;
  puVar1[10] = puVar1 + 0x10;
  puVar1[0xb] = 1;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  *(undefined4 *)(puVar1 + 0xe) = 0x3f800000;
  puVar1[0xf] = 0;
  puVar1[0x10] = 0;
  *(undefined1 *)(puVar1 + 0x11) = 0;
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>
         )(__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}